

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O2

int __thiscall cmXMLParser::ParseBuffer(cmXMLParser *this,char *buffer,size_type count)

{
  XML_Status XVar1;
  
  XVar1 = XML_Parse((XML_Parser)this->Parser,buffer,(int)count,0);
  if (XVar1 == XML_STATUS_ERROR) {
    (*this->_vptr_cmXMLParser[0xb])(this);
  }
  return (uint)(XVar1 != XML_STATUS_ERROR);
}

Assistant:

int cmXMLParser::ParseBuffer(const char* buffer, std::string::size_type count)
{
  // Pass the buffer to the expat XML parser.
  if (!XML_Parse(static_cast<XML_Parser>(this->Parser), buffer,
                 static_cast<int>(count), 0)) {
    this->ReportXmlParseError();
    return 0;
  }
  return 1;
}